

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O3

void Aig_CManStoreNum(Aig_CMan_t *p,uint x)

{
  byte *pbVar1;
  uchar *puVar2;
  bool bVar3;
  ulong uVar4;
  
  if (x < 0x80) {
    uVar4 = (ulong)x;
  }
  else {
    uVar4 = (ulong)x;
    do {
      pbVar1 = p->pCur;
      p->pCur = pbVar1 + 1;
      *pbVar1 = (byte)x | 0x80;
      uVar4 = uVar4 >> 7;
      bVar3 = 0x3fff < x;
      x = (uint)uVar4;
    } while (bVar3);
  }
  puVar2 = p->pCur;
  p->pCur = puVar2 + 1;
  *puVar2 = (uchar)uVar4;
  if ((long)(p->pCur + (-0x28 - (long)p)) < (long)p->nBytes + -10) {
    return;
  }
  __assert_fail("p->pCur - p->Data < p->nBytes - 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                ,0x1b1,"void Aig_CManStoreNum(Aig_CMan_t *, unsigned int)");
}

Assistant:

void Aig_CManStoreNum( Aig_CMan_t * p, unsigned x )
{
    while ( x & ~0x7f )
    {
        *p->pCur++ = (x & 0x7f) | 0x80;
        x >>= 7;
    }
    *p->pCur++ = x;
    assert( p->pCur - p->Data < p->nBytes - 10 );
}